

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

size_t kex_method_strlen(LIBSSH2_COMMON_METHOD **method)

{
  size_t sVar1;
  bool bVar2;
  undefined8 local_20;
  size_t len;
  LIBSSH2_COMMON_METHOD **method_local;
  
  local_20 = 0;
  if ((method == (LIBSSH2_COMMON_METHOD **)0x0) ||
     (len = (size_t)method, *method == (LIBSSH2_COMMON_METHOD *)0x0)) {
    method_local = (LIBSSH2_COMMON_METHOD **)0x0;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (*(long *)len != 0) {
        bVar2 = **(long **)len != 0;
      }
      if (!bVar2) break;
      sVar1 = strlen((char *)**(undefined8 **)len);
      local_20 = sVar1 + 1 + local_20;
      len = len + 8;
    }
    method_local = (LIBSSH2_COMMON_METHOD **)(local_20 + -1);
  }
  return (size_t)method_local;
}

Assistant:

static size_t
kex_method_strlen(LIBSSH2_COMMON_METHOD ** method)
{
    size_t len = 0;

    if(!method || !*method) {
        return 0;
    }

    while(*method && (*method)->name) {
        len += strlen((*method)->name) + 1;
        method++;
    }

    return len - 1;
}